

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422AlphaToARGBRow_C
               (uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *src_a,uint8_t *rgb_buf,
               YuvConstants *yuvconstants,int width)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  long in_RSI;
  uint8_t *in_R8;
  YuvConstants *unaff_retaddr;
  uint in_stack_00000008;
  int x;
  int local_34;
  uint8_t v;
  uint8_t u;
  uint8_t y;
  
  for (local_34 = 0; v = (uint8_t)((ulong)in_RSI >> 0x28), u = (uint8_t)((ulong)in_RSI >> 0x30),
      y = (uint8_t)((ulong)in_RSI >> 0x38), local_34 < (int)(in_stack_00000008 - 1);
      local_34 = local_34 + 2) {
    libyuv::YuvPixel(y,u,v,in_RDX,in_RCX,in_R8,unaff_retaddr);
    in_R8[3] = *in_RCX;
    libyuv::YuvPixel((uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                     (uint8_t)((ulong)in_RSI >> 0x28),in_RDX,in_RCX,in_R8,unaff_retaddr);
    in_R8[7] = in_RCX[1];
    in_RSI = in_RSI + 1;
    in_RDX = in_RDX + 1;
    in_RCX = in_RCX + 2;
    in_R8 = in_R8 + 8;
  }
  if ((in_stack_00000008 & 1) != 0) {
    libyuv::YuvPixel(y,u,v,in_RDX,in_RCX,in_R8,unaff_retaddr);
    in_R8[3] = *in_RCX;
  }
  return;
}

Assistant:

void I422AlphaToARGBRow_C(const uint8_t* src_y,
                          const uint8_t* src_u,
                          const uint8_t* src_v,
                          const uint8_t* src_a,
                          uint8_t* rgb_buf,
                          const struct YuvConstants* yuvconstants,
                          int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = src_a[0];
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = src_a[1];
    src_y += 2;
    src_u += 1;
    src_v += 1;
    src_a += 2;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = src_a[0];
  }
}